

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void chunkpool_free2(chunkpool *ctx,cb_free *f)

{
  cb_free *f_local;
  chunkpool *ctx_local;
  
  while (-1 < ctx->chunk) {
    if (f != (cb_free *)0x0) {
      do {
        ctx->chunk_pos = ctx->chunk_pos - ctx->chunk_size;
        (*f)((void *)((long)ctx->chunks[ctx->chunk] + (long)ctx->chunk_pos));
      } while (0 < ctx->chunk_pos);
      ctx->chunk_pos = ctx->chunk_max;
    }
    free(ctx->chunks[ctx->chunk]);
    ctx->chunk = ctx->chunk + -1;
  }
  ctx->chunk_size = -1;
  ctx->chunk_max = -1;
  ctx->chunk_pos = -1;
  return;
}

Assistant:

void
chunkpool_free2(struct chunkpool *ctx, cb_free *f)
{
    while(ctx->chunk >= 0)
    {
        if(f != NULL)
        {
            do
            {
                ctx->chunk_pos -= ctx->chunk_size;
                f((char*)ctx->chunks[ctx->chunk] + ctx->chunk_pos);
            }
            while(ctx->chunk_pos > 0);
            ctx->chunk_pos = ctx->chunk_max;
        }
	free(ctx->chunks[ctx->chunk]);
	ctx->chunk -= 1;
    }
    ctx->chunk_size = -1;
    ctx->chunk_max = -1;
    ctx->chunk_pos = -1;
}